

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.c
# Opt level: O1

OptionResult * option_parser_next(OptionResult *__return_storage_ptr__,OptionParser *parser)

{
  int iVar1;
  int iVar2;
  char **ppcVar3;
  anon_union_8_2_3250017c_for_OptionResult_2 aVar4;
  char *__s;
  int iVar5;
  size_t __n;
  Option *pOVar6;
  OptionResultKind OVar7;
  Option *pOVar8;
  anon_union_8_2_3250017c_for_OptionResult_2 aVar9;
  size_t sVar10;
  bool bVar11;
  OptionResultKind local_64;
  Option *local_60;
  anon_union_8_2_3250017c_for_OptionResult_2 local_58;
  
  iVar5 = parser->arg_index;
  iVar1 = parser->argc;
  if (iVar5 < iVar1) {
    ppcVar3 = parser->argv;
    parser->arg_index = iVar5 + 1;
    aVar4 = (anon_union_8_2_3250017c_for_OptionResult_2)
            ((anon_union_8_2_3250017c_for_OptionResult_2 *)(ppcVar3 + iVar5))->value;
    if (*aVar4.value == '-') {
      sVar10 = parser->num_options;
      if (aVar4.value[1] == '-') {
        if (sVar10 != 0) {
          local_64 = __return_storage_ptr__->kind;
          pOVar6 = parser->options;
          local_60 = __return_storage_ptr__->option;
          local_58 = __return_storage_ptr__->field_2;
          do {
            __s = pOVar6->long_name;
            if (__s == (char *)0x0) {
              bVar11 = false;
            }
            else {
              __n = strlen(__s);
              iVar5 = strncmp(aVar4.value + 2,__s,__n);
              bVar11 = false;
              if (iVar5 == 0) {
                bVar11 = true;
                local_60 = pOVar6;
                if (pOVar6->has_value == 0) {
                  local_64 = OPTION_RESULT_KIND_OPTION;
LAB_001081f4:
                  local_58.value = (char *)0x0;
                }
                else {
                  if (aVar4.value[__n + 2] == '=') {
                    aVar9.value = aVar4.value + __n + 3;
                  }
                  else {
                    iVar5 = parser->arg_index;
                    if (iVar1 <= iVar5) {
                      local_64 = OPTION_RESULT_KIND_EXPECTED_VALUE;
                      goto LAB_001081f4;
                    }
                    parser->arg_index = iVar5 + 1;
                    aVar9 = (anon_union_8_2_3250017c_for_OptionResult_2)
                            ((anon_union_8_2_3250017c_for_OptionResult_2 *)(ppcVar3 + iVar5))->value
                    ;
                  }
                  local_58.value = (char *)0x0;
                  if (*aVar9.value != '\0') {
                    local_58 = aVar9;
                  }
                  local_64 = (uint)(*aVar9.value != '\0') * 2 + OPTION_RESULT_KIND_EXPECTED_VALUE;
                }
              }
            }
            if (bVar11) {
              __return_storage_ptr__->option = local_60;
              __return_storage_ptr__->field_2 = local_58;
              __return_storage_ptr__->kind = local_64;
              return __return_storage_ptr__;
            }
            pOVar6 = pOVar6 + 1;
            sVar10 = sVar10 - 1;
          } while (sVar10 != 0);
          __return_storage_ptr__->option = local_60;
          __return_storage_ptr__->field_2 = local_58;
        }
      }
      else if (sVar10 != 0) {
        OVar7 = __return_storage_ptr__->kind;
        pOVar6 = parser->options;
        pOVar8 = __return_storage_ptr__->option;
        aVar9 = __return_storage_ptr__->field_2;
        do {
          if (pOVar6->short_name == '\0') {
            iVar5 = 7;
          }
          else {
            iVar5 = 0;
            if (pOVar6->short_name == aVar4.value[1]) {
              iVar5 = 1;
              OVar7 = OPTION_RESULT_KIND_BAD_SHORT_OPTION;
              aVar9 = aVar4;
              pOVar8 = pOVar6;
              if (aVar4.value[2] == '\0') {
                if (pOVar6->has_value == 0) {
                  OVar7 = OPTION_RESULT_KIND_OPTION;
                  aVar9.value = (char *)0x0;
                }
                else {
                  iVar2 = parser->arg_index;
                  if (iVar2 < iVar1) {
                    parser->arg_index = iVar2 + 1;
                    bVar11 = *((anon_union_8_2_3250017c_for_OptionResult_2 *)(ppcVar3 + iVar2))->
                              value != '\0';
                    aVar9.value = (char *)0x0;
                    if (bVar11) {
                      aVar9.value = ((anon_union_8_2_3250017c_for_OptionResult_2 *)(ppcVar3 + iVar2)
                                    )->value;
                    }
                    OVar7 = (uint)bVar11 * 2 + OPTION_RESULT_KIND_EXPECTED_VALUE;
                  }
                  else {
                    OVar7 = OPTION_RESULT_KIND_EXPECTED_VALUE;
                    aVar9.value = (char *)0x0;
                  }
                }
              }
            }
          }
          if ((iVar5 != 7) && (iVar5 != 0)) {
            __return_storage_ptr__->option = pOVar8;
            __return_storage_ptr__->field_2 = aVar9;
            __return_storage_ptr__->kind = OVar7;
            return __return_storage_ptr__;
          }
          pOVar6 = pOVar6 + 1;
          sVar10 = sVar10 - 1;
        } while (sVar10 != 0);
        __return_storage_ptr__->option = pOVar8;
        __return_storage_ptr__->field_2 = aVar9;
      }
      __return_storage_ptr__->kind = OPTION_RESULT_KIND_UNKNOWN;
    }
    else {
      __return_storage_ptr__->kind = OPTION_RESULT_KIND_ARG;
    }
    __return_storage_ptr__->option = (Option *)0x0;
    (__return_storage_ptr__->field_2).value = (char *)aVar4;
  }
  else {
    __return_storage_ptr__->kind = OPTION_RESULT_KIND_DONE;
    __return_storage_ptr__->option = (Option *)0x0;
    (__return_storage_ptr__->field_2).value = (char *)0x0;
  }
  return __return_storage_ptr__;
}

Assistant:

OptionResult option_parser_next(OptionParser* parser) {
  if (parser->arg_index >= parser->argc) {
    return make_option_result(OPTION_RESULT_KIND_DONE, NULL, NULL);
  }

  char* arg = parser->argv[parser->arg_index++];
  if (arg[0] == '-') {
    size_t i;
    if (arg[1] == '-') {
      /* Long option. */
      for (i = 0; i < parser->num_options; ++i) {
        const Option* option = &parser->options[i];
        if (!option->long_name) {
          continue;
        }

        size_t long_name_len = strlen(option->long_name);
        if (strncmp(&arg[2], option->long_name, long_name_len) == 0) {
          if (option->has_value) {
            if (arg[2 + long_name_len] == '=') {
              char* value = &arg[2 + long_name_len + 1];
              return make_option_result_with_value(OPTION_RESULT_KIND_OPTION,
                                                   option, value);
            } else {
              if (parser->arg_index >= parser->argc) {
                return make_option_result(OPTION_RESULT_KIND_EXPECTED_VALUE,
                                          option, NULL);
              }

              char* value = parser->argv[parser->arg_index++];
              return make_option_result_with_value(OPTION_RESULT_KIND_OPTION,
                                                   option, value);
            }
          } else {
            return make_option_result(OPTION_RESULT_KIND_OPTION, option, NULL);
          }
        }
      }
    } else {
      /* Short option. */
      for (i = 0; i < parser->num_options; ++i) {
        const Option* option = &parser->options[i];
        if (!option->short_name) {
          continue;
        }

        if (option->short_name == arg[1]) {
          if (arg[2] == 0) {
            if (option->has_value) {
              if (parser->arg_index >= parser->argc) {
                return make_option_result(OPTION_RESULT_KIND_EXPECTED_VALUE,
                                          option, NULL);
              }

              char* value = parser->argv[parser->arg_index++];
              return make_option_result_with_value(OPTION_RESULT_KIND_OPTION,
                                                   option, value);
            } else {
              return make_option_result(OPTION_RESULT_KIND_OPTION, option,
                                        NULL);
            }
          } else {
            return make_option_result(OPTION_RESULT_KIND_BAD_SHORT_OPTION,
                                      option, arg);
          }
        }
      }
    }

    return make_option_result(OPTION_RESULT_KIND_UNKNOWN, NULL, arg);
  } else {
    /* Argument. */
    return make_option_result(OPTION_RESULT_KIND_ARG, NULL, arg);
  }
}